

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol_test.cpp
# Opt level: O2

string * CreatePacketV1(string *__return_storage_ptr__,string *user_data)

{
  Packet packet;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  packet.user_data_._M_dataplus._M_p = (pointer)&packet.user_data_.field_2;
  packet.user_data_._M_string_length = 0;
  packet.user_data_.field_2._M_local_buf[0] = '\0';
  packet.packet_type_ = '\0';
  packet.application_id_ = 0x3039;
  packet.peer_id_ = 0xd431;
  packet.snapshot_index_ = 0x499602d2;
  std::__cxx11::string::_M_assign((string *)&packet.user_data_);
  udpdiscovery::Packet::Serialize(&packet,kProtocolVersion1,__return_storage_ptr__);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string CreatePacketV1(const std::string& user_data) {
  std::string result;

  udpdiscovery::Packet packet;
  packet.set_packet_type(udpdiscovery::kPacketIAmHere);
  packet.set_application_id(kApplicationId);
  packet.set_peer_id(kPeerId);
  packet.set_snapshot_index(kSnapshotIndex);
  packet.set_user_data(user_data);

  packet.Serialize(udpdiscovery::kProtocolVersion1, result);

  return result;
}